

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

string * convert(char *from,char *to,char *_src,size_t size,string *out)

{
  ostream *poVar1;
  size_t sVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  size_t ret;
  size_t src_len;
  size_t dst_len;
  char *dst;
  char *src;
  int i;
  iconv_t ic;
  char to_ignore [100];
  char *out_buf;
  size_t buf_len;
  allocator local_59;
  string local_58 [8];
  string orig_src;
  string *out_local;
  size_t size_local;
  char *_src_local;
  char *to_local;
  char *from_local;
  
  if (size == 0) {
    std::__cxx11::string::operator=((string *)out,"");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,_src,size,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::resize((ulong)out);
    register0x00000000 = std::__cxx11::string::data();
    sprintf((char *)&ic,"%s//IGNORE",to);
    _i = iconv_open((char *)&ic,from);
    if (_i == (iconv_t)0xffffffffffffffff) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"iconv_open error: ");
      poVar1 = std::operator<<(poVar1,from);
      poVar1 = std::operator<<(poVar1," -> ");
      poVar1 = std::operator<<(poVar1,to);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::operator=((string *)out,"");
    }
    else {
      for (src._0_4_ = 0; (int)src < 100; src._0_4_ = (int)src + 1) {
        dst = (char *)std::__cxx11::string::data();
        dst_len = stack0xffffffffffffff80;
        ret = size;
        src_len = size * 2 + 10;
        sVar2 = iconv(_i,&dst,&ret,(char **)&dst_len,&src_len);
        pcVar5 = dst;
        if ((sVar2 != 0xffffffffffffffff) ||
           (lVar3 = std::__cxx11::string::data(), size <= (ulong)((long)pcVar5 - lVar3))) {
          iconv_close(_i);
          std::__cxx11::string::resize((ulong)out);
          goto LAB_002276c1;
        }
        poVar1 = std::operator<<((ostream *)&std::cerr,"iconv failed: ");
        poVar1 = std::operator<<(poVar1,from);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = std::operator<<(poVar1,to);
        poVar1 = std::operator<<(poVar1,":");
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        poVar1 = std::operator<<(poVar1,pcVar5);
        poVar1 = std::operator<<(poVar1,"at ");
        pcVar5 = dst;
        lVar3 = std::__cxx11::string::data();
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(long)pcVar5 - lVar3);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        pcVar5 = dst;
        lVar3 = std::__cxx11::string::data();
        if (pcVar5 + (2 - lVar3) < size) {
          if ((byte)*dst < 0x81) {
            *dst = ' ';
          }
          else {
            *dst = ' ';
            dst[1] = ' ';
          }
        }
        else {
          *dst = ' ';
        }
      }
      std::__cxx11::string::resize((ulong)out);
    }
LAB_002276c1:
    src._4_4_ = 1;
    std::__cxx11::string::~string(local_58);
  }
  return out;
}

Assistant:

static std::string& convert(const char* from, const char* to, const char* _src, size_t size, std::string* out)
{
    // std::cout<<"convert " << from <<"," << to << "," << size << std::endl;
    if (size == 0 ) {
        *out = "";
        return *out;
    }

    std::string orig_src(_src, size);

    size_t buf_len = size*2 + 10;
    out->resize(buf_len);

    char* out_buf = (char*)out->data();

    char to_ignore[100];
    // char from_ignore[100];
    sprintf(to_ignore, "%s//IGNORE", to);
    iconv_t ic = iconv_open(to_ignore, from);
    // iconv_t ic = iconv_open(to, from);

    if ((size_t)ic == -1) {
        std::cerr << "iconv_open error: " << from << " -> " << to << std::endl;
        *out = "";
        return *out;
    }


    //while (true) {
    for (int i = 0; i < 100; i++) { // max try 100
        char* src = (char*)orig_src.data();
        char* dst = out_buf;
        size_t dst_len = buf_len;
        size_t src_len = size;

        size_t ret = iconv(ic, (char**)&src, &src_len, &dst, &dst_len);
        if ( (ret == (size_t)-1) && (src - orig_src.data() < size) ) {
            std::cerr << "iconv failed: " << from << "," << to << ":" << strerror(errno)
                << "at " << (src - orig_src.data()) << std::endl;

            if (src - orig_src.data() + 2 < size) {
                if ((uint8_t)src[0] > 0x80 ) {
                    src[0] = ' ';
                    src[1] = ' ';
                }
                else {
                    src[0] = ' ';
                }
            } else {
                src[0] = ' ';
            }
            continue;
        } else {
            iconv_close(ic);
            out->resize(buf_len - dst_len);            
            return *out;
        }
    }
    out->resize(0);
    return *out;
}